

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsEncoder.cpp
# Opt level: O0

void __thiscall
Js::AsmJsEncoder::ReadOpTemplate<(Js::LayoutSize)2>(AsmJsEncoder *this,OpCodeAsmJs op)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  OpLayoutDouble1Reg1_Large *playout_x00100;
  OpLayoutFloat1Reg1_Large *playout_x00101;
  OpLayoutInt1Reg1_Large *playout_x00102;
  OpLayoutAsmCall_Large *pOVar6;
  OpLayoutReg1Double1_Large *pOVar7;
  OpLayoutReg1Float1_Large *playout_x00103;
  OpLayoutReg1Int1_Large *pOVar8;
  OpLayoutBrInt1_Large *playout_x00104;
  OpLayoutBrInt2_Large *pOVar9;
  OpLayoutBrInt1Const1_Large *playout_x00105;
  OpLayoutInt1Double1_Large *playout_x00106;
  OpLayoutDouble1Int1_Large *pOVar10;
  OpLayoutDouble1Float1_Large *playout_x00107;
  OpLayoutInt1Float1_Large *playout_x00108;
  OpLayoutAsmTypedArr_Large *pOVar11;
  OpLayoutInt1Const1_Large *playout_x00109;
  OpLayoutDouble2_Large *pOVar12;
  OpLayoutDouble3_Large *pOVar13;
  OpLayoutFloat3_Large *pOVar14;
  OpLayoutInt1Double2_Large *pOVar15;
  OpLayoutInt1Float2_Large *pOVar16;
  OpLayoutInt3_Large *pOVar17;
  OpLayoutInt2_Large *pOVar18;
  OpLayoutFloat2_Large *pOVar19;
  OpLayoutFloat1Double1_Large *playout_x00110;
  OpLayoutFloat1Int1_Large *playout_x00111;
  OpLayoutAsmUnsigned1_Large *playout_x00112;
  OpLayoutElementSlot_Large *pOVar20;
  OpLayoutFloat32x4_1Float4_Large *playout_x00113;
  OpLayoutInt32x4_1Int4_Large *playout_x00114;
  OpLayoutFloat32x4_2_Large *pOVar21;
  OpLayoutInt32x4_2_Large *pOVar22;
  OpLayoutFloat32x4_1Float1_Large *playout_x00115;
  OpLayoutInt32x4_1Int1_Large *playout_x00116;
  OpLayoutFloat32x4_1Int32x4_1_Large *pOVar23;
  OpLayoutInt32x4_1Float32x4_1_Large *pOVar24;
  OpLayoutFloat32x4_3_Large *pOVar25;
  OpLayoutBool32x4_1Float32x4_2_Large *pOVar26;
  OpLayoutBool32x4_1Int32x4_2_Large *pOVar27;
  OpLayoutInt32x4_3_Large *pOVar28;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Large *playout_x00117;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Large *playout_x00118;
  OpLayoutReg1Float32x4_1_Large *playout_x00119;
  OpLayoutReg1Int32x4_1_Large *playout_x00120;
  OpLayoutInt1Int32x4_1Int1_Large *playout_x00121;
  OpLayoutFloat1Float32x4_1Int1_Large *playout_x00122;
  OpLayoutInt32x4_2Int2_Large *playout_x00123;
  OpLayoutFloat32x4_2Int1Float1_Large *playout_x00124;
  char16 *pcVar29;
  undefined4 *puVar30;
  OpLayoutFloat32x4_2Int1Float1_Large *playout_170;
  OpLayoutInt32x4_2Int2_Large *playout_169;
  OpLayoutFloat1Float32x4_1Int1_Large *playout_168;
  OpLayoutInt1Int32x4_1Int1_Large *playout_167;
  OpLayoutReg1Int32x4_1_Large *playout_166;
  OpLayoutReg1Float32x4_1_Large *playout_165;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Large *playout_164;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Large *playout_163;
  OpLayoutInt32x4_3_Large *playout_162;
  OpLayoutInt32x4_3_Large *playout_161;
  OpLayoutInt32x4_3_Large *playout_160;
  OpLayoutBool32x4_1Float32x4_2_Large *playout_159;
  OpLayoutBool32x4_1Int32x4_2_Large *playout_158;
  OpLayoutBool32x4_1Float32x4_2_Large *playout_157;
  OpLayoutBool32x4_1Float32x4_2_Large *playout_156;
  OpLayoutBool32x4_1Float32x4_2_Large *playout_155;
  OpLayoutBool32x4_1Int32x4_2_Large *playout_154;
  OpLayoutBool32x4_1Float32x4_2_Large *playout_153;
  OpLayoutBool32x4_1Int32x4_2_Large *playout_152;
  OpLayoutBool32x4_1Float32x4_2_Large *playout_151;
  OpLayoutFloat32x4_3_Large *playout_150;
  OpLayoutFloat32x4_3_Large *playout_149;
  OpLayoutFloat32x4_3_Large *playout_148;
  OpLayoutInt32x4_3_Large *playout_147;
  OpLayoutFloat32x4_3_Large *playout_146;
  OpLayoutInt32x4_3_Large *playout_145;
  OpLayoutFloat32x4_3_Large *playout_144;
  OpLayoutInt32x4_3_Large *playout_143;
  OpLayoutFloat32x4_3_Large *playout_142;
  OpLayoutInt32x4_2_Large *playout_141;
  OpLayoutFloat32x4_2_Large *playout_140;
  OpLayoutFloat32x4_2_Large *playout_139;
  OpLayoutFloat32x4_2_Large *playout_138;
  OpLayoutInt32x4_2_Large *playout_137;
  OpLayoutFloat32x4_2_Large *playout_136;
  OpLayoutFloat32x4_2_Large *playout_135;
  OpLayoutInt32x4_1Float32x4_1_Large *playout_134;
  OpLayoutInt32x4_1Float32x4_1_Large *playout_133;
  OpLayoutFloat32x4_1Int32x4_1_Large *playout_132;
  OpLayoutFloat32x4_1Int32x4_1_Large *playout_131;
  OpLayoutInt32x4_1Int1_Large *playout_130;
  OpLayoutFloat32x4_1Float1_Large *playout_129;
  OpLayoutInt32x4_2_Large *playout_128;
  OpLayoutFloat32x4_2_Large *playout_127;
  OpLayoutInt32x4_1Int4_Large *playout_126;
  OpLayoutFloat32x4_1Float4_Large *playout_125;
  OpLayoutElementSlot_Large *playout_124;
  OpLayoutElementSlot_Large *playout_123;
  OpLayoutElementSlot_Large *playout_122;
  OpLayoutElementSlot_Large *playout_121;
  OpLayoutInt32x4_2_Large *playout_120;
  OpLayoutFloat32x4_2_Large *playout_119;
  OpLayoutAsmUnsigned1_Large *playout_118;
  OpLayoutFloat1Int1_Large *playout_117;
  OpLayoutFloat1Double1_Large *playout_116;
  OpLayoutFloat2_Large *playout_115;
  int local_468;
  int offsets_19 [3];
  OpLayoutDouble3_Large *playout_114;
  int local_450;
  int offsets_18 [3];
  OpLayoutDouble3_Large *playout_113;
  int local_438;
  int offsets_17 [3];
  OpLayoutDouble3_Large *playout_112;
  int offsets_16 [2];
  OpLayoutFloat2_Large *playout_111;
  int offsets_15 [2];
  OpLayoutDouble2_Large *playout_110;
  int offsets_14 [2];
  OpLayoutFloat2_Large *playout_109;
  int offsets_13 [2];
  OpLayoutDouble2_Large *playout_108;
  int local_3e0;
  int offsets_12 [3];
  OpLayoutDouble3_Large *playout_107;
  int offsets_11 [2];
  OpLayoutDouble2_Large *playout_106;
  int offsets_10 [2];
  OpLayoutDouble2_Large *playout_105;
  int offsets_9 [2];
  OpLayoutFloat2_Large *playout_104;
  int offsets_8 [2];
  OpLayoutDouble2_Large *playout_103;
  int offsets_7 [2];
  OpLayoutFloat2_Large *playout_102;
  int offsets_6 [2];
  OpLayoutDouble2_Large *playout_101;
  int offsets_5 [2];
  OpLayoutDouble2_Large *playout_100;
  int offsets_4 [2];
  OpLayoutDouble2_Large *playout_99;
  int offsets_3 [2];
  OpLayoutDouble2_Large *playout_98;
  int offsets_2 [2];
  OpLayoutDouble2_Large *playout_97;
  int offsets_1 [2];
  OpLayoutDouble2_Large *playout_96;
  int offsets [2];
  OpLayoutDouble2_Large *playout_95;
  OpLayoutInt2_Large *playout_94;
  OpLayoutInt3_Large *playout_93;
  OpLayoutInt3_Large *playout_92;
  OpLayoutInt3_Large *playout_91;
  OpLayoutInt2_Large *playout_90;
  OpLayoutInt1Float2_Large *playout_89;
  OpLayoutInt1Float2_Large *playout_88;
  OpLayoutInt1Float2_Large *playout_87;
  OpLayoutInt1Float2_Large *playout_86;
  OpLayoutInt1Float2_Large *playout_85;
  OpLayoutInt1Float2_Large *playout_84;
  OpLayoutInt1Double2_Large *playout_83;
  OpLayoutInt1Double2_Large *playout_82;
  OpLayoutInt1Double2_Large *playout_81;
  OpLayoutInt1Double2_Large *playout_80;
  OpLayoutInt1Double2_Large *playout_79;
  OpLayoutInt1Double2_Large *playout_78;
  OpLayoutInt3_Large *playout_77;
  OpLayoutInt3_Large *playout_76;
  OpLayoutInt3_Large *playout_75;
  OpLayoutInt3_Large *playout_74;
  OpLayoutInt3_Large *playout_73;
  OpLayoutInt3_Large *playout_72;
  OpLayoutInt3_Large *playout_71;
  OpLayoutInt3_Large *playout_70;
  OpLayoutInt3_Large *playout_69;
  OpLayoutInt3_Large *playout_68;
  OpLayoutFloat3_Large *playout_67;
  OpLayoutFloat3_Large *playout_66;
  OpLayoutFloat3_Large *playout_65;
  OpLayoutFloat3_Large *playout_64;
  OpLayoutFloat2_Large *playout_63;
  OpLayoutDouble3_Large *playout_62;
  OpLayoutDouble3_Large *playout_61;
  OpLayoutDouble3_Large *playout_60;
  OpLayoutDouble3_Large *playout_59;
  OpLayoutDouble3_Large *playout_58;
  OpLayoutDouble2_Large *playout_57;
  OpLayoutFloat2_Large *playout_56;
  OpLayoutDouble2_Large *playout_55;
  OpLayoutInt3_Large *playout_54;
  OpLayoutInt3_Large *playout_53;
  OpLayoutInt3_Large *playout_52;
  OpLayoutInt3_Large *playout_51;
  OpLayoutInt3_Large *playout_50;
  OpLayoutInt3_Large *playout_49;
  OpLayoutInt3_Large *playout_48;
  OpLayoutInt3_Large *playout_47;
  OpLayoutInt3_Large *playout_46;
  OpLayoutInt3_Large *playout_45;
  OpLayoutInt3_Large *playout_44;
  OpLayoutInt3_Large *playout_43;
  OpLayoutInt3_Large *playout_42;
  OpLayoutInt2_Large *playout_41;
  OpLayoutInt2_Large *playout_40;
  OpLayoutInt2_Large *playout_39;
  OpLayoutInt2_Large *playout_38;
  OpLayoutInt2_Large *playout_37;
  OpLayoutInt1Const1_Large *playout_36;
  OpLayoutAsmTypedArr_Large *playout_35;
  OpLayoutAsmTypedArr_Large *playout_34;
  OpLayoutAsmTypedArr_Large *playout_33;
  OpLayoutAsmTypedArr_Large *playout_32;
  OpLayoutElementSlot_Large *playout_31;
  OpLayoutElementSlot_Large *playout_30;
  OpLayoutElementSlot_Large *playout_29;
  OpLayoutElementSlot_Large *playout_28;
  OpLayoutElementSlot_Large *playout_27;
  OpLayoutElementSlot_Large *playout_26;
  OpLayoutElementSlot_Large *playout_25;
  OpLayoutElementSlot_Large *playout_24;
  OpLayoutElementSlot_Large *playout_23;
  OpLayoutInt2_Large *playout_22;
  OpLayoutFloat2_Large *playout_21;
  OpLayoutDouble2_Large *playout_20;
  OpLayoutInt1Float1_Large *playout_19;
  OpLayoutDouble1Float1_Large *playout_18;
  OpLayoutDouble1Int1_Large *playout_17;
  OpLayoutDouble1Int1_Large *playout_16;
  OpLayoutInt1Double1_Large *playout_15;
  OpLayoutBrInt1Const1_Large *playout_14;
  OpLayoutBrInt2_Large *playout_13;
  OpLayoutInt2_Large *playout_12;
  OpLayoutBrInt2_Large *playout_11;
  OpLayoutBrInt1_Large *playout_10;
  OpLayoutReg1Int1_Large *playout_9;
  OpLayoutReg1Float1_Large *playout_8;
  OpLayoutReg1Double1_Large *playout_7;
  OpLayoutAsmCall_Large *playout_6;
  OpLayoutInt1Reg1_Large *playout_5;
  OpLayoutFloat1Reg1_Large *playout_4;
  OpLayoutDouble1Reg1_Large *playout_3;
  OpLayoutReg1Int1_Large *playout_2;
  OpLayoutReg1Double1_Large *playout_1;
  OpLayoutAsmCall_Large *playout;
  OpCodeAsmJs op_local;
  AsmJsEncoder *this_local;
  
  switch(op) {
  case Ld_IntConst:
    playout_x00109 = ByteCodeReader::Int1Const1_Large(&this->mReader,&this->ip);
    Op_LdConst_Int<Js::OpLayoutT_Int1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00109);
    break;
  case Ld_Int:
    pOVar18 = ByteCodeReader::Int2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar18->I0);
    iVar5 = CalculateOffset<int>(this,pOVar18->I1);
    AsmJsJitTemplate::Ld_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  default:
    pcVar29 = OpCodeUtilAsmJs::GetOpCodeName(op);
    Output::Print(L"Dispatch to bad opcode : %s\n",pcVar29);
    Output::Flush();
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar30 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar30 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsEncoder.cpp"
                                ,0x6a,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar30 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar30 = 0;
    break;
  case Ld_Flt:
    pOVar19 = ByteCodeReader::Float2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<float>(this,pOVar19->F0);
    iVar5 = CalculateOffset<float>(this,pOVar19->F1);
    AsmJsJitTemplate::Ld_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case Ld_Db:
    pOVar12 = ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<double>(this,pOVar12->D0);
    iVar5 = CalculateOffset<double>(this,pOVar12->D1);
    AsmJsJitTemplate::Ld_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case Call:
    pOVar6 = ByteCodeReader::AsmCall_Large(&this->mReader,&this->ip);
    OP_Call<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>(this,pOVar6);
    break;
  case ArgOut_Int:
    pOVar8 = ByteCodeReader::Reg1Int1_Large(&this->mReader,&this->ip);
    OP_ArgOut_Int<Js::OpLayoutT_Reg1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar8);
    break;
  case ArgOut_Db:
    pOVar7 = ByteCodeReader::Reg1Double1_Large(&this->mReader,&this->ip);
    OP_ArgOut_Db<Js::OpLayoutT_Reg1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar7);
    break;
  case Conv_VTI:
    playout_x00102 = ByteCodeReader::Int1Reg1_Large(&this->mReader,&this->ip);
    OP_Conv_VTI<Js::OpLayoutT_Int1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00102);
    break;
  case Conv_VTF:
    playout_x00101 = ByteCodeReader::Float1Reg1_Large(&this->mReader,&this->ip);
    OP_Conv_VTF<Js::OpLayoutT_Float1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00101);
    break;
  case Conv_VTD:
    playout_x00100 = ByteCodeReader::Double1Reg1_Large(&this->mReader,&this->ip);
    OP_Conv_VTD<Js::OpLayoutT_Double1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00100);
    break;
  case I_Call:
    pOVar6 = ByteCodeReader::AsmCall_Large(&this->mReader,&this->ip);
    OP_I_Call<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar6);
    break;
  case I_ArgOut_Db:
    pOVar7 = ByteCodeReader::Reg1Double1_Large(&this->mReader,&this->ip);
    OP_I_ArgOut_Db<Js::OpLayoutT_Reg1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar7);
    break;
  case I_ArgOut_Int:
    pOVar8 = ByteCodeReader::Reg1Int1_Large(&this->mReader,&this->ip);
    OP_I_ArgOut_Int<Js::OpLayoutT_Reg1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar8);
    break;
  case I_ArgOut_Flt:
    playout_x00103 = ByteCodeReader::Reg1Float1_Large(&this->mReader,&this->ip);
    OP_I_ArgOut_Flt<Js::OpLayoutT_Reg1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00103);
    break;
  case AsmJsLoopBodyStart:
    playout_x00112 = ByteCodeReader::AsmUnsigned1_Large(&this->mReader,&this->ip);
    OP_AsmJsLoopBody<Js::OpLayoutT_AsmUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00112);
    break;
  case BrTrue_Int:
    playout_x00104 = ByteCodeReader::BrInt1_Large(&this->mReader,&this->ip);
    OP_BrTrue<Js::OpLayoutT_BrInt1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00104);
    break;
  case BrEq_Int:
    pOVar9 = ByteCodeReader::BrInt2_Large(&this->mReader,&this->ip);
    OP_BrEq<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>(this,pOVar9);
    break;
  case BeginSwitch_Int:
    pOVar18 = ByteCodeReader::Int2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar18->I0);
    iVar5 = CalculateOffset<int>(this,pOVar18->I1);
    AsmJsJitTemplate::Ld_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case Case_Int:
    pOVar9 = ByteCodeReader::BrInt2_Large(&this->mReader,&this->ip);
    OP_BrEq<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>(this,pOVar9);
    break;
  case Case_IntConst:
    playout_x00105 = ByteCodeReader::BrInt1Const1_Large(&this->mReader,&this->ip);
    OP_BrEqConst<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00105);
    break;
  case Conv_DTI:
    playout_x00106 = ByteCodeReader::Int1Double1_Large(&this->mReader,&this->ip);
    Op_Db_To_Int<Js::OpLayoutT_Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00106);
    break;
  case Conv_FTI:
    playout_x00108 = ByteCodeReader::Int1Float1_Large(&this->mReader,&this->ip);
    Op_Float_To_Int<Js::OpLayoutT_Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00108);
    break;
  case Conv_ITD:
    pOVar10 = ByteCodeReader::Double1Int1_Large(&this->mReader,&this->ip);
    Op_Int_To_Db<Js::OpLayoutT_Double1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar10);
    break;
  case Conv_FTD:
    playout_x00107 = ByteCodeReader::Double1Float1_Large(&this->mReader,&this->ip);
    Op_Float_To_Db<Js::OpLayoutT_Double1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00107);
    break;
  case Conv_UTD:
    pOVar10 = ByteCodeReader::Double1Int1_Large(&this->mReader,&this->ip);
    Op_UInt_To_Db<Js::OpLayoutT_Double1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar10);
    break;
  case Return_Db:
    pOVar12 = ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    OP_SetReturnDouble<Js::OpLayoutT_Double2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar12);
    break;
  case Return_Flt:
    pOVar19 = ByteCodeReader::Float2_Large(&this->mReader,&this->ip);
    OP_SetReturnFloat<Js::OpLayoutT_Float2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar19);
    break;
  case Return_Int:
    pOVar18 = ByteCodeReader::Int2_Large(&this->mReader,&this->ip);
    OP_SetReturnInt<Js::OpLayoutT_Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar18);
    break;
  case LdSlotArr:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    OP_LdSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case LdSlot:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    OP_LdSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case LdSlot_Db:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    Op_LdSlot_Db<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case LdSlot_Int:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    Op_LdSlot_Int<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case LdSlot_Flt:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    Op_LdSlot_Flt<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case StSlot_Db:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    Op_StSlot_Db<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case StSlot_Int:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    Op_StSlot_Int<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case StSlot_Flt:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    Op_StSlot_Flt<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case LdArr_Func:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<void*>(this,pOVar20->Value);
    iVar5 = CalculateOffset<void*>(this,pOVar20->Instance);
    iVar3 = CalculateOffset<int>(this,pOVar20->SlotIndex);
    AsmJsJitTemplate::LdArr_Func::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case LdArr:
    pOVar11 = ByteCodeReader::AsmTypedArr_Large(&this->mReader,&this->ip);
    Op_LdArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar11);
    break;
  case LdArrConst:
    pOVar11 = ByteCodeReader::AsmTypedArr_Large(&this->mReader,&this->ip);
    Op_LdArrConst<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar11);
    break;
  case StArr:
    pOVar11 = ByteCodeReader::AsmTypedArr_Large(&this->mReader,&this->ip);
    Op_StArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar11);
    break;
  case StArrConst:
    pOVar11 = ByteCodeReader::AsmTypedArr_Large(&this->mReader,&this->ip);
    Op_StArrConst<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar11);
    break;
  case Neg_Int:
    pOVar18 = ByteCodeReader::Int2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar18->I0);
    iVar5 = CalculateOffset<int>(this,pOVar18->I1);
    AsmJsJitTemplate::Neg_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case Not_Int:
    pOVar18 = ByteCodeReader::Int2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar18->I0);
    iVar5 = CalculateOffset<int>(this,pOVar18->I1);
    AsmJsJitTemplate::Not_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case LogNot_Int:
    pOVar18 = ByteCodeReader::Int2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar18->I0);
    iVar5 = CalculateOffset<int>(this,pOVar18->I1);
    AsmJsJitTemplate::LogNot_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case Conv_ITB:
    pOVar18 = ByteCodeReader::Int2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar18->I0);
    iVar5 = CalculateOffset<int>(this,pOVar18->I1);
    AsmJsJitTemplate::Int_To_Bool::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case Add_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Add_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Sub_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Sub_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Mul_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Mul_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Div_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Div_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Rem_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Rem_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case And_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::And_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Or_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Or_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Xor_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Xor_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Shl_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Shl_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Shr_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Shr_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Shr_UInt:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Shr_UInt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Div_UInt:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Div_UInt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Rem_UInt:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Rem_UInt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Neg_Db:
    pOVar12 = ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<double>(this,pOVar12->D0);
    iVar5 = CalculateOffset<double>(this,pOVar12->D1);
    AsmJsJitTemplate::Neg_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case Add_Db:
    pOVar13 = ByteCodeReader::Double3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<double>(this,pOVar13->D0);
    iVar5 = CalculateOffset<double>(this,pOVar13->D1);
    iVar3 = CalculateOffset<double>(this,pOVar13->D2);
    AsmJsJitTemplate::Add_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Sub_Db:
    pOVar13 = ByteCodeReader::Double3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<double>(this,pOVar13->D0);
    iVar5 = CalculateOffset<double>(this,pOVar13->D1);
    iVar3 = CalculateOffset<double>(this,pOVar13->D2);
    AsmJsJitTemplate::Sub_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Mul_Db:
    pOVar13 = ByteCodeReader::Double3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<double>(this,pOVar13->D0);
    iVar5 = CalculateOffset<double>(this,pOVar13->D1);
    iVar3 = CalculateOffset<double>(this,pOVar13->D2);
    AsmJsJitTemplate::Mul_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Div_Db:
    pOVar13 = ByteCodeReader::Double3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<double>(this,pOVar13->D0);
    iVar5 = CalculateOffset<double>(this,pOVar13->D1);
    iVar3 = CalculateOffset<double>(this,pOVar13->D2);
    AsmJsJitTemplate::Div_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Rem_Db:
    pOVar13 = ByteCodeReader::Double3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<double>(this,pOVar13->D0);
    iVar5 = CalculateOffset<double>(this,pOVar13->D1);
    iVar3 = CalculateOffset<double>(this,pOVar13->D2);
    AsmJsJitTemplate::Rem_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Neg_Flt:
    pOVar19 = ByteCodeReader::Float2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<float>(this,pOVar19->F0);
    iVar5 = CalculateOffset<float>(this,pOVar19->F1);
    AsmJsJitTemplate::Neg_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case Add_Flt:
    pOVar14 = ByteCodeReader::Float3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<float>(this,pOVar14->F0);
    iVar5 = CalculateOffset<float>(this,pOVar14->F1);
    iVar3 = CalculateOffset<float>(this,pOVar14->F2);
    AsmJsJitTemplate::Add_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Sub_Flt:
    pOVar14 = ByteCodeReader::Float3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<float>(this,pOVar14->F0);
    iVar5 = CalculateOffset<float>(this,pOVar14->F1);
    iVar3 = CalculateOffset<float>(this,pOVar14->F2);
    AsmJsJitTemplate::Sub_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Mul_Flt:
    pOVar14 = ByteCodeReader::Float3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<float>(this,pOVar14->F0);
    iVar5 = CalculateOffset<float>(this,pOVar14->F1);
    iVar3 = CalculateOffset<float>(this,pOVar14->F2);
    AsmJsJitTemplate::Mul_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Div_Flt:
    pOVar14 = ByteCodeReader::Float3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<float>(this,pOVar14->F0);
    iVar5 = CalculateOffset<float>(this,pOVar14->F1);
    iVar3 = CalculateOffset<float>(this,pOVar14->F2);
    AsmJsJitTemplate::Div_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmLt_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Lt_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmLe_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Le_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmGt_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Gt_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmGe_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Ge_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmEq_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Eq_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmNe_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Ne_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmLt_UInt:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Lt_UInt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmLe_UInt:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Le_UInt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmGt_UInt:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Gt_UInt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmGe_UInt:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Ge_UInt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmLt_Db:
    pOVar15 = ByteCodeReader::Int1Double2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar15->I0);
    iVar5 = CalculateOffset<double>(this,pOVar15->D1);
    iVar3 = CalculateOffset<double>(this,pOVar15->D2);
    AsmJsJitTemplate::CmpLt_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmLe_Db:
    pOVar15 = ByteCodeReader::Int1Double2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar15->I0);
    iVar5 = CalculateOffset<double>(this,pOVar15->D1);
    iVar3 = CalculateOffset<double>(this,pOVar15->D2);
    AsmJsJitTemplate::CmpLe_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmGt_Db:
    pOVar15 = ByteCodeReader::Int1Double2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar15->I0);
    iVar5 = CalculateOffset<double>(this,pOVar15->D1);
    iVar3 = CalculateOffset<double>(this,pOVar15->D2);
    AsmJsJitTemplate::CmpGt_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmGe_Db:
    pOVar15 = ByteCodeReader::Int1Double2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar15->I0);
    iVar5 = CalculateOffset<double>(this,pOVar15->D1);
    iVar3 = CalculateOffset<double>(this,pOVar15->D2);
    AsmJsJitTemplate::CmpGe_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmEq_Db:
    pOVar15 = ByteCodeReader::Int1Double2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar15->I0);
    iVar5 = CalculateOffset<double>(this,pOVar15->D1);
    iVar3 = CalculateOffset<double>(this,pOVar15->D2);
    AsmJsJitTemplate::CmpEq_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmNe_Db:
    pOVar15 = ByteCodeReader::Int1Double2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar15->I0);
    iVar5 = CalculateOffset<double>(this,pOVar15->D1);
    iVar3 = CalculateOffset<double>(this,pOVar15->D2);
    AsmJsJitTemplate::CmpNe_Db::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmLt_Flt:
    pOVar16 = ByteCodeReader::Int1Float2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar16->I0);
    iVar5 = CalculateOffset<float>(this,pOVar16->F1);
    iVar3 = CalculateOffset<float>(this,pOVar16->F2);
    AsmJsJitTemplate::CmpLt_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmLe_Flt:
    pOVar16 = ByteCodeReader::Int1Float2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar16->I0);
    iVar5 = CalculateOffset<float>(this,pOVar16->F1);
    iVar3 = CalculateOffset<float>(this,pOVar16->F2);
    AsmJsJitTemplate::CmpLe_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmGt_Flt:
    pOVar16 = ByteCodeReader::Int1Float2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar16->I0);
    iVar5 = CalculateOffset<float>(this,pOVar16->F1);
    iVar3 = CalculateOffset<float>(this,pOVar16->F2);
    AsmJsJitTemplate::CmpGt_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmGe_Flt:
    pOVar16 = ByteCodeReader::Int1Float2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar16->I0);
    iVar5 = CalculateOffset<float>(this,pOVar16->F1);
    iVar3 = CalculateOffset<float>(this,pOVar16->F2);
    AsmJsJitTemplate::CmpGe_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmEq_Flt:
    pOVar16 = ByteCodeReader::Int1Float2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar16->I0);
    iVar5 = CalculateOffset<float>(this,pOVar16->F1);
    iVar3 = CalculateOffset<float>(this,pOVar16->F2);
    AsmJsJitTemplate::CmpEq_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case CmNe_Flt:
    pOVar16 = ByteCodeReader::Int1Float2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar16->I0);
    iVar5 = CalculateOffset<float>(this,pOVar16->F1);
    iVar3 = CalculateOffset<float>(this,pOVar16->F2);
    AsmJsJitTemplate::CmpNe_Flt::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Abs_Int:
    pOVar18 = ByteCodeReader::Int2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar18->I0);
    iVar5 = CalculateOffset<int>(this,pOVar18->I1);
    AsmJsJitTemplate::Abs_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case Min_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Min_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Max_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Max_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Imul_Int:
    pOVar17 = ByteCodeReader::Int3_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar17->I0);
    iVar5 = CalculateOffset<int>(this,pOVar17->I1);
    iVar3 = CalculateOffset<int>(this,pOVar17->I2);
    AsmJsJitTemplate::Mul_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5,iVar3);
    break;
  case Clz32_Int:
    pOVar18 = ByteCodeReader::Int2_Large(&this->mReader,&this->ip);
    iVar4 = CalculateOffset<int>(this,pOVar18->I0);
    iVar5 = CalculateOffset<int>(this,pOVar18->I1);
    AsmJsJitTemplate::Clz32_Int::ApplyTemplate(this,&this->mPc,iVar4,iVar5);
    break;
  case Sin_Db:
    offsets = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_96._0_4_ = CalculateOffset<double>(this,*(int *)offsets);
    playout_96._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_96,Math::Sin,false);
    break;
  case Cos_Db:
    offsets_1 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_97._0_4_ = CalculateOffset<double>(this,*(int *)offsets_1);
    playout_97._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_1 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_97,Math::Cos,false);
    break;
  case Tan_Db:
    offsets_2 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_98._0_4_ = CalculateOffset<double>(this,*(int *)offsets_2);
    playout_98._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_2 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_98,Math::Tan,false);
    break;
  case Asin_Db:
    offsets_3 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_99._0_4_ = CalculateOffset<double>(this,*(int *)offsets_3);
    playout_99._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_3 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_99,Math::Asin,false);
    break;
  case Acos_Db:
    offsets_4 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_100._0_4_ = CalculateOffset<double>(this,*(int *)offsets_4);
    playout_100._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_4 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_100,Math::Acos,false)
    ;
    break;
  case Atan_Db:
    offsets_5 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_101._0_4_ = CalculateOffset<double>(this,*(int *)offsets_5);
    playout_101._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_5 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_101,Math::Atan,false)
    ;
    break;
  case Abs_Db:
    offsets_15 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_111._0_4_ = CalculateOffset<double>(this,*(int *)offsets_15);
    playout_111._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_15 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_111,Math::Abs,false);
    break;
  case Ceil_Db:
    offsets_6 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_102._0_4_ = CalculateOffset<double>(this,*(int *)offsets_6);
    playout_102._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_6 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_102,ceil,true);
    break;
  case Ceil_Flt:
    offsets_7 = (int  [2])ByteCodeReader::Float2_Large(&this->mReader,&this->ip);
    playout_103._0_4_ = CalculateOffset<float>(this,*(int *)offsets_7);
    playout_103._4_4_ = CalculateOffset<float>(this,*(int *)((long)offsets_7 + 4));
    AsmJsJitTemplate::Call_Flt::ApplyTemplate(this,&this->mPc,2,(int *)&playout_103,ceilf,true);
    break;
  case Floor_Db:
    offsets_8 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_104._0_4_ = CalculateOffset<double>(this,*(int *)offsets_8);
    playout_104._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_8 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_104,floor,true);
    break;
  case Floor_Flt:
    offsets_9 = (int  [2])ByteCodeReader::Float2_Large(&this->mReader,&this->ip);
    playout_105._0_4_ = CalculateOffset<float>(this,*(int *)offsets_9);
    playout_105._4_4_ = CalculateOffset<float>(this,*(int *)((long)offsets_9 + 4));
    AsmJsJitTemplate::Call_Flt::ApplyTemplate(this,&this->mPc,2,(int *)&playout_105,floorf,true);
    break;
  case Exp_Db:
    offsets_10 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_106._0_4_ = CalculateOffset<double>(this,*(int *)offsets_10);
    playout_106._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_10 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_106,Math::Exp,false);
    break;
  case Log_Db:
    offsets_11 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_107._0_4_ = CalculateOffset<double>(this,*(int *)offsets_11);
    playout_107._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_11 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_107,Math::Log,false);
    break;
  case Pow_Db:
    offsets_12._4_8_ = ByteCodeReader::Double3_Large(&this->mReader,&this->ip);
    playout_108._4_4_ =
         CalculateOffset<double>(this,((OpLayoutDouble3_Large *)offsets_12._4_8_)->D0);
    local_3e0 = CalculateOffset<double>(this,*(int *)(offsets_12._4_8_ + 4));
    offsets_12[0] = CalculateOffset<double>(this,*(int *)(offsets_12._4_8_ + 8));
    AsmJsJitTemplate::Call_Db::ApplyTemplate
              (this,&this->mPc,3,(int *)((long)&playout_108 + 4),Math::Pow,false);
    break;
  case Sqrt_Db:
    offsets_13 = (int  [2])ByteCodeReader::Double2_Large(&this->mReader,&this->ip);
    playout_109._0_4_ = CalculateOffset<double>(this,*(int *)offsets_13);
    playout_109._4_4_ = CalculateOffset<double>(this,*(int *)((long)offsets_13 + 4));
    AsmJsJitTemplate::Call_Db::ApplyTemplate(this,&this->mPc,2,(int *)&playout_109,sqrt,true);
    break;
  case Sqrt_Flt:
    offsets_14 = (int  [2])ByteCodeReader::Float2_Large(&this->mReader,&this->ip);
    playout_110._0_4_ = CalculateOffset<float>(this,*(int *)offsets_14);
    playout_110._4_4_ = CalculateOffset<float>(this,*(int *)((long)offsets_14 + 4));
    AsmJsJitTemplate::Call_Flt::ApplyTemplate(this,&this->mPc,2,(int *)&playout_110,sqrtf,true);
    break;
  case Abs_Flt:
    offsets_16 = (int  [2])ByteCodeReader::Float2_Large(&this->mReader,&this->ip);
    playout_112._0_4_ = CalculateOffset<float>(this,*(int *)offsets_16);
    playout_112._4_4_ = CalculateOffset<float>(this,*(int *)((long)offsets_16 + 4));
    AsmJsJitTemplate::Call_Flt::ApplyTemplate(this,&this->mPc,2,(int *)&playout_112,fabsf,true);
    break;
  case Atan2_Db:
    offsets_17._4_8_ = ByteCodeReader::Double3_Large(&this->mReader,&this->ip);
    playout_113._4_4_ =
         CalculateOffset<double>(this,((OpLayoutDouble3_Large *)offsets_17._4_8_)->D0);
    local_438 = CalculateOffset<double>(this,*(int *)(offsets_17._4_8_ + 4));
    offsets_17[0] = CalculateOffset<double>(this,*(int *)(offsets_17._4_8_ + 8));
    AsmJsJitTemplate::Call_Db::ApplyTemplate
              (this,&this->mPc,3,(int *)((long)&playout_113 + 4),Math::Atan2,false);
    break;
  case Min_Db:
    offsets_18._4_8_ = ByteCodeReader::Double3_Large(&this->mReader,&this->ip);
    playout_114._4_4_ =
         CalculateOffset<double>(this,((OpLayoutDouble3_Large *)offsets_18._4_8_)->D0);
    local_450 = CalculateOffset<double>(this,*(int *)(offsets_18._4_8_ + 4));
    offsets_18[0] = CalculateOffset<double>(this,*(int *)(offsets_18._4_8_ + 8));
    AsmJsJitTemplate::Call_Db::ApplyTemplate
              (this,&this->mPc,3,(int *)((long)&playout_114 + 4),AsmJsMath::Min<double>,false);
    break;
  case Max_Db:
    offsets_19._4_8_ = ByteCodeReader::Double3_Large(&this->mReader,&this->ip);
    playout_115._4_4_ =
         CalculateOffset<double>(this,((OpLayoutDouble3_Large *)offsets_19._4_8_)->D0);
    local_468 = CalculateOffset<double>(this,*(int *)(offsets_19._4_8_ + 4));
    offsets_19[0] = CalculateOffset<double>(this,*(int *)(offsets_19._4_8_ + 8));
    AsmJsJitTemplate::Call_Db::ApplyTemplate
              (this,&this->mPc,3,(int *)((long)&playout_115 + 4),AsmJsMath::Max<double>,false);
    break;
  case Fround_Flt:
    pOVar19 = ByteCodeReader::Float2_Large(&this->mReader,&this->ip);
    OP_SetFroundFlt<Js::OpLayoutT_Float2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar19);
    break;
  case Fround_Db:
    playout_x00110 = ByteCodeReader::Float1Double1_Large(&this->mReader,&this->ip);
    OP_SetFroundDb<Js::OpLayoutT_Float1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00110);
    break;
  case Fround_Int:
    playout_x00111 = ByteCodeReader::Float1Int1_Large(&this->mReader,&this->ip);
    OP_SetFroundInt<Js::OpLayoutT_Float1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00111);
    break;
  case Simd128_IntsToI4:
    playout_x00114 = ByteCodeReader::Int32x4_1Int4_Large(&this->mReader,&this->ip);
    OP_Simd128_IntsToI4<Js::OpLayoutT_Int32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00114);
    break;
  case Simd128_Splat_I4:
    playout_x00116 = ByteCodeReader::Int32x4_1Int1_Large(&this->mReader,&this->ip);
    OP_Simd128_SplatI4<Js::OpLayoutT_Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00116);
    break;
  case Simd128_FromFloat32x4_I4:
    pOVar24 = ByteCodeReader::Int32x4_1Float32x4_1_Large(&this->mReader,&this->ip);
    OP_Simd128_FromFloat32x4I4<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar24);
    break;
  case Simd128_FromFloat32x4Bits_I4:
    pOVar24 = ByteCodeReader::Int32x4_1Float32x4_1_Large(&this->mReader,&this->ip);
    OP_Simd128_FromFloat32x4BitsI4<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar24);
    break;
  case Simd128_Neg_I4:
    pOVar22 = ByteCodeReader::Int32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_NegI4<Js::OpLayoutT_Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar22);
    break;
  case Simd128_Add_I4:
    pOVar28 = ByteCodeReader::Int32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_AddI4<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar28);
    break;
  case Simd128_Sub_I4:
    pOVar28 = ByteCodeReader::Int32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_SubI4<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar28);
    break;
  case Simd128_Mul_I4:
    pOVar28 = ByteCodeReader::Int32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_MulI4<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar28);
    break;
  case Simd128_Lt_I4:
    pOVar27 = ByteCodeReader::Bool32x4_1Int32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_LtI4<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar27);
    break;
  case Simd128_Gt_I4:
    pOVar27 = ByteCodeReader::Bool32x4_1Int32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_GtI4<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar27);
    break;
  case Simd128_Eq_I4:
    pOVar27 = ByteCodeReader::Bool32x4_1Int32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_EqI4<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar27);
    break;
  case Simd128_Select_I4:
    playout_x00118 = ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_SelectI4<Js::OpLayoutT_Int32x4_1Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00118);
    break;
  case Simd128_And_I4:
    pOVar28 = ByteCodeReader::Int32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_AndI4<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar28);
    break;
  case Simd128_Or_I4:
    pOVar28 = ByteCodeReader::Int32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_OrI4<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar28);
    break;
  case Simd128_Xor_I4:
    pOVar28 = ByteCodeReader::Int32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_XorI4<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar28);
    break;
  case Simd128_Not_I4:
    pOVar22 = ByteCodeReader::Int32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_NotI4<Js::OpLayoutT_Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar22);
    break;
  case Simd128_Ld_I4:
    pOVar22 = ByteCodeReader::Int32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_LdI4<Js::OpLayoutT_Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar22);
    break;
  case Simd128_LdSlot_I4:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    OP_Simd128_LdSlotI4<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case Simd128_StSlot_I4:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    OP_Simd128_StSlotI4<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case Simd128_Return_I4:
    pOVar22 = ByteCodeReader::Int32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_ReturnI4<Js::OpLayoutT_Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar22);
    break;
  case Simd128_I_ArgOut_I4:
    playout_x00120 = ByteCodeReader::Reg1Int32x4_1_Large(&this->mReader,&this->ip);
    OP_Simd128_I_ArgOutI4<Js::OpLayoutT_Reg1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00120);
    break;
  case Simd128_FloatsToF4:
    playout_x00113 = ByteCodeReader::Float32x4_1Float4_Large(&this->mReader,&this->ip);
    OP_Simd128_FloatsToF4<Js::OpLayoutT_Float32x4_1Float4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00113);
    break;
  case Simd128_Splat_F4:
    playout_x00115 = ByteCodeReader::Float32x4_1Float1_Large(&this->mReader,&this->ip);
    OP_Simd128_SplatF4<Js::OpLayoutT_Float32x4_1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00115);
    break;
  case Simd128_FromInt32x4_F4:
    pOVar23 = ByteCodeReader::Float32x4_1Int32x4_1_Large(&this->mReader,&this->ip);
    OP_Simd128_FromInt32x4F4<Js::OpLayoutT_Float32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar23);
    break;
  case Simd128_FromInt32x4Bits_F4:
    pOVar23 = ByteCodeReader::Float32x4_1Int32x4_1_Large(&this->mReader,&this->ip);
    OP_Simd128_FromInt32x4BitsF4<Js::OpLayoutT_Float32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar23);
    break;
  case Simd128_Abs_F4:
    pOVar21 = ByteCodeReader::Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_AbsF4<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar21);
    break;
  case Simd128_Neg_F4:
    pOVar21 = ByteCodeReader::Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_NegF4<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar21);
    break;
  case Simd128_Add_F4:
    pOVar25 = ByteCodeReader::Float32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_AddF4<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar25);
    break;
  case Simd128_Sub_F4:
    pOVar25 = ByteCodeReader::Float32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_SubF4<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar25);
    break;
  case Simd128_Mul_F4:
    pOVar25 = ByteCodeReader::Float32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_MulF4<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar25);
    break;
  case Simd128_Div_F4:
    pOVar25 = ByteCodeReader::Float32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_DivF4<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar25);
    break;
  case Simd128_Min_F4:
    pOVar25 = ByteCodeReader::Float32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_MinF4<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar25);
    break;
  case Simd128_Max_F4:
    pOVar25 = ByteCodeReader::Float32x4_3_Large(&this->mReader,&this->ip);
    OP_Simd128_MaxF4<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar25);
    break;
  case Simd128_Rcp_F4:
    pOVar21 = ByteCodeReader::Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_RcpF4<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar21);
    break;
  case Simd128_RcpSqrt_F4:
    pOVar21 = ByteCodeReader::Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_RcpSqrtF4<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar21);
    break;
  case Simd128_Sqrt_F4:
    pOVar21 = ByteCodeReader::Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_SqrtF4<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar21);
    break;
  case Simd128_Lt_F4:
    pOVar26 = ByteCodeReader::Bool32x4_1Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_LtF4<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar26);
    break;
  case Simd128_LtEq_F4:
    pOVar26 = ByteCodeReader::Bool32x4_1Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_LtEqF4<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar26);
    break;
  case Simd128_Eq_F4:
    pOVar26 = ByteCodeReader::Bool32x4_1Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_EqF4<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar26);
    break;
  case Simd128_Neq_F4:
    pOVar26 = ByteCodeReader::Bool32x4_1Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_NeqF4<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar26);
    break;
  case Simd128_Gt_F4:
    pOVar26 = ByteCodeReader::Bool32x4_1Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_GtF4<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar26);
    break;
  case Simd128_GtEq_F4:
    pOVar26 = ByteCodeReader::Bool32x4_1Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_GtEqF4<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar26);
    break;
  case Simd128_Select_F4:
    playout_x00117 =
         ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_SelectF4<Js::OpLayoutT_Float32x4_1Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00117);
    break;
  case Simd128_Ld_F4:
    pOVar21 = ByteCodeReader::Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_LdF4<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar21);
    break;
  case Simd128_LdSlot_F4:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    OP_Simd128_LdSlotF4<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case Simd128_StSlot_F4:
    pOVar20 = ByteCodeReader::ElementSlot_Large(&this->mReader,&this->ip);
    OP_Simd128_StSlotF4<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar20);
    break;
  case Simd128_Return_F4:
    pOVar21 = ByteCodeReader::Float32x4_2_Large(&this->mReader,&this->ip);
    OP_Simd128_ReturnF4<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,pOVar21);
    break;
  case Simd128_I_ArgOut_F4:
    playout_x00119 = ByteCodeReader::Reg1Float32x4_1_Large(&this->mReader,&this->ip);
    OP_Simd128_I_ArgOutF4<Js::OpLayoutT_Reg1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00119);
    break;
  case Simd128_ExtractLane_I4:
    playout_x00121 = ByteCodeReader::Int1Int32x4_1Int1_Large(&this->mReader,&this->ip);
    OP_Simd128_ExtractLaneI4<Js::OpLayoutT_Int1Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00121);
    break;
  case Simd128_ReplaceLane_I4:
    playout_x00123 = ByteCodeReader::Int32x4_2Int2_Large(&this->mReader,&this->ip);
    OP_Simd128_ReplaceLaneI4<Js::OpLayoutT_Int32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00123);
    break;
  case Simd128_ExtractLane_F4:
    playout_x00122 = ByteCodeReader::Float1Float32x4_1Int1_Large(&this->mReader,&this->ip);
    OP_Simd128_ExtractLaneF4<Js::OpLayoutT_Float1Float32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00122);
    break;
  case Simd128_ReplaceLane_F4:
    playout_x00124 = ByteCodeReader::Float32x4_2Int1Float1_Large(&this->mReader,&this->ip);
    OP_Simd128_ReplaceLaneF4<Js::OpLayoutT_Float32x4_2Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (this,playout_x00124);
  }
  return;
}

Assistant:

void AsmJsEncoder::ReadOpTemplate<Js::LargeLayout>( OpCodeAsmJs op )
    {
        switch( op )
        {
#define DEF2_WMS(x, op, func) PROCESS_ENCODE_##x##_COMMON(op, func, _Large)
#define DEF3_WMS(x, op, func, y) PROCESS_ENCODE_##x##_COMMON(op, func, y, _Large)
#define DEF4_WMS(x, op, func, y, t) PROCESS_ENCODE_##x##_COMMON(op, func, y, _Large, t)
#define EXDEF2_WMS(x, op, func) PROCESS_ENCODE_##x##_COMMON(op, func, _Large)
#define EXDEF3_WMS(x, op, func, y) PROCESS_ENCODE_##x##_COMMON(op, func, y, _Large)
#define EXDEF4_WMS(x, op, func, y, t) PROCESS_ENCODE_##x##_COMMON(op, func, y, _Large, t)
#include "AsmJsEncoderHandler.inl"
        default:
            // Help the C++ optimizer by declaring that the cases we
            // have above are sufficient
#if DBG_DUMP
            Output::Print( _u("Dispatch to bad opcode : %s\n"), OpCodeUtilAsmJs::GetOpCodeName(op));
            Output::Flush();
#endif
            Assert( false );
            __assume( false );
        };
    }